

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O3

optional<long_long> QGregorianCalendar::julianFromParts(int year,int month,int day)

{
  undefined8 in_RAX;
  undefined4 extraout_var;
  _Storage<long_long,_true> _Var1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  optional<long_long> oVar7;
  optional<long_long> oVar8;
  
  oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value._0_1_ = year == 0;
  if (0 < day && year != 0) {
    _Var1._0_4_ = monthLength(month,year);
    _Var1._M_value._4_4_ = extraout_var;
    if (_Var1._0_4_ < (uint)day) {
      uVar3 = 0;
    }
    else {
      iVar2 = month + 9;
      if (2 < month) {
        iVar2 = month + -3;
      }
      uVar4 = (year - (year >> 0x1f)) - (uint)(month < 3);
      if ((int)uVar4 < 0) {
        uVar5 = (ulong)(int)~(~uVar4 / 100);
        uVar6 = (ulong)(int)~(~uVar4 / 400);
      }
      else {
        uVar5 = (ulong)uVar4 / 100;
        uVar6 = (ulong)uVar4 / 400;
      }
      _Var1._M_value =
           (((ulong)(uint)day + ((long)(int)uVar4 >> 2) + (long)(int)uVar4 * 0x16d +
            (ulong)(iVar2 * 0x99 + 2) / 5) - uVar5) + uVar6 + 0x1a431f;
      uVar3 = CONCAT71((int7)(int3)(uVar4 >> 8) >> 2,1);
    }
    oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._8_8_ = uVar3;
    oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._M_payload._M_value = _Var1._M_value;
    return (optional<long_long>)
           oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>;
  }
  oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = 0;
  return (optional<long_long>)
         oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

bool QGregorianCalendar::validParts(int year, int month, int day)
{
    return year && 0 < day && day <= monthLength(month, year);
}